

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::IStreamingReporter::listTags
          (IStreamingReporter *this,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags,
          IConfig *config)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  ReusableStringStream *pRVar4;
  Column *pCVar5;
  size_t newIndent;
  size_type count;
  allocator<char> local_159;
  string local_158;
  pluralise local_138;
  string local_110;
  Column local_f0;
  undefined1 local_b8 [8];
  Column wrapper;
  string str;
  undefined1 local_50 [8];
  ReusableStringStream rss;
  TagInfo *tagCount;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *__range1;
  IConfig *config_local;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags_local;
  IStreamingReporter *this_local;
  
  uVar2 = (*config->_vptr_IConfig[0xe])();
  if ((uVar2 & 1) == 0) {
    poVar3 = cout();
    std::operator<<(poVar3,"All available tags:\n");
  }
  else {
    poVar3 = cout();
    std::operator<<(poVar3,"Tags for matching test cases:\n");
  }
  __end1 = std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::begin(tags);
  tagCount = (TagInfo *)std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::end(tags);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
                                *)&tagCount);
    if (!bVar1) break;
    rss.m_oss = (ostream *)
                __gnu_cxx::
                __normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
                ::operator*(&__end1);
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_50);
    pRVar4 = ReusableStringStream::operator<<
                       ((ReusableStringStream *)local_50,(char (*) [3])0x36591b);
    str.field_2._8_4_ = std::setw(2);
    pRVar4 = ReusableStringStream::operator<<(pRVar4,(_Setw *)((long)&str.field_2 + 8));
    pRVar4 = ReusableStringStream::operator<<(pRVar4,(unsigned_long *)(rss.m_oss + 0x30));
    ReusableStringStream::operator<<(pRVar4,(char (*) [3])0x36591b);
    ReusableStringStream::str_abi_cxx11_
              ((string *)&wrapper.m_initialIndent,(ReusableStringStream *)local_50);
    TagInfo::all_abi_cxx11_(&local_110,(TagInfo *)rss.m_oss);
    TextFlow::Column::Column(&local_f0,&local_110);
    pCVar5 = TextFlow::Column::initialIndent(&local_f0,0);
    newIndent = std::__cxx11::string::size();
    pCVar5 = TextFlow::Column::indent(pCVar5,newIndent);
    pCVar5 = TextFlow::Column::width(pCVar5,0x46);
    TextFlow::Column::Column((Column *)local_b8,pCVar5);
    TextFlow::Column::~Column(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    poVar3 = cout();
    poVar3 = std::operator<<(poVar3,(string *)&wrapper.m_initialIndent);
    poVar3 = TextFlow::operator<<(poVar3,(Column *)local_b8);
    std::operator<<(poVar3,'\n');
    TextFlow::Column::~Column((Column *)local_b8);
    std::__cxx11::string::~string((string *)&wrapper.m_initialIndent);
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_50);
    __gnu_cxx::
    __normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
    ::operator++(&__end1);
  }
  poVar3 = cout();
  count = std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::size(tags);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"tag",&local_159);
  pluralise::pluralise(&local_138,count,&local_158);
  poVar3 = Catch::operator<<(poVar3,&local_138);
  poVar3 = std::operator<<(poVar3,'\n');
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pluralise::~pluralise(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  return;
}

Assistant:

void IStreamingReporter::listTags(std::vector<TagInfo> const &tags, IConfig const &config) {
        if (config.hasTestFilters()) {
            Catch::cout() << "Tags for matching test cases:\n";
        }
        else {
            Catch::cout() << "All available tags:\n";
        }

        for (auto const &tagCount : tags) {
            ReusableStringStream rss;
            rss << "  " << std::setw(2) << tagCount.count << "  ";
            auto str = rss.str();
            auto wrapper = TextFlow::Column(tagCount.all())
                .initialIndent(0)
                .indent(str.size())
                .width(CATCH_CONFIG_CONSOLE_WIDTH - 10);
            Catch::cout() << str << wrapper << '\n';
        }
        Catch::cout() << pluralise(tags.size(), "tag") << '\n' << std::endl;
    }